

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cc
# Opt level: O1

Entry * __thiscall mcc::SymbolTable::GetField(SymbolTable *this,Type *type,string *field)

{
  element_type *peVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  mapped_type *pmVar4;
  Entry *pEVar5;
  
  if ((type->type_ != T_NONE) &&
     (peVar1 = (type->name).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 != (element_type *)0x0)) {
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->types_,&peVar1->identifier_);
    pEVar5 = pmVar4->next;
    if (pEVar5 != (Entry *)0x0) {
      __s2 = (field->_M_dataplus)._M_p;
      sVar2 = field->_M_string_length;
      do {
        __n = (pEVar5->name)._M_string_length;
        if (__n == sVar2) {
          if (__n == 0) {
            return pEVar5;
          }
          iVar3 = bcmp((pEVar5->name)._M_dataplus._M_p,__s2,__n);
          if (iVar3 == 0) {
            return pEVar5;
          }
        }
        pEVar5 = pEVar5->next;
      } while (pEVar5 != (Entry *)0x0);
    }
  }
  return (Entry *)0x0;
}

Assistant:

Entry* SymbolTable::GetField(const Type& type, const std::string& field) {
  if (type.type_ == TokenType::T_NONE || type.name == nullptr) return nullptr;
  Entry* fields = types_[type.name->String()].next;
  while (fields != nullptr) {
    if (fields->name == field) {
      return fields;
    }
    fields = fields->next;
  }

  return nullptr;
}